

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O2

void __thiscall gl4cts::BufferStorage::Buffer::UnMap(Buffer *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  UnMap((Functions *)CONCAT44(extraout_var,iVar1),this->m_target);
  return;
}

Assistant:

void Buffer::UnMap()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	UnMap(gl, m_target);
}